

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O0

bool __thiscall SNMPTrap::build(SNMPTrap *this)

{
  ComplexType *pCVar1;
  element_type *peVar2;
  shared_ptr<BER_CONTAINER> local_240;
  undefined1 local_230 [32];
  undefined1 local_210 [24];
  undefined1 local_1f8 [8];
  shared_ptr<ComplexType> ourVBList;
  shared_ptr<TimestampType> local_1e0;
  shared_ptr<BER_CONTAINER> local_1d0;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  shared_ptr<BER_CONTAINER> local_190;
  undefined1 local_180 [32];
  shared_ptr<BER_CONTAINER> local_160;
  undefined1 local_150 [32];
  shared_ptr<BER_CONTAINER> local_130;
  undefined1 local_120 [32];
  shared_ptr<BER_CONTAINER> local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  undefined1 local_c0 [24];
  undefined1 local_a8 [8];
  shared_ptr<ComplexType> trapPDU;
  shared_ptr<OctetType> local_90;
  shared_ptr<BER_CONTAINER> local_80;
  undefined1 local_70 [40];
  shared_ptr<BER_CONTAINER> local_48;
  ComplexType local_38;
  SNMPTrap *this_local;
  
  pCVar1 = (this->super_SNMPPacket).packet;
  local_38.values.
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (pCVar1 != (ComplexType *)0x0) {
    (*(pCVar1->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  if (this->trapOID == (OIDType *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    pCVar1 = (ComplexType *)operator_new(0x28);
    ComplexType::ComplexType(pCVar1,STRUCTURE);
    (this->super_SNMPPacket).packet = pCVar1;
    pCVar1 = (this->super_SNMPPacket).packet;
    local_70._20_4_ = (this->super_SNMPPacket).snmpVersion;
    std::make_shared<IntegerType,int>((int *)(local_70 + 0x18));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              (&local_48,(shared_ptr<IntegerType> *)(local_70 + 0x18));
    ComplexType::addValueToList(&local_38,(shared_ptr<BER_CONTAINER> *)pCVar1);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_38);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_48);
    std::shared_ptr<IntegerType>::~shared_ptr((shared_ptr<IntegerType> *)(local_70 + 0x18));
    pCVar1 = (this->super_SNMPPacket).packet;
    trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::c_str();
    std::make_shared<OctetType,char_const*>((char **)&local_90);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>(&local_80,&local_90);
    ComplexType::addValueToList((ComplexType *)local_70,(shared_ptr<BER_CONTAINER> *)pCVar1);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_70);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_80);
    std::shared_ptr<OctetType>::~shared_ptr(&local_90);
    local_c0._20_4_ = 0xa4;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_a8);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
    OIDType::cloneOID((OIDType *)local_e0);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_e0 + 0x10),(shared_ptr<OIDType> *)local_e0);
    ComplexType::addValueToList((ComplexType *)local_c0,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_c0);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)(local_e0 + 0x10));
    std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_e0);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
    std::make_shared<NetworkAddress,IPAddress&>((IPAddress *)(local_120 + 0x10));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<NetworkAddress,void>
              (&local_100,(shared_ptr<NetworkAddress> *)(local_120 + 0x10));
    ComplexType::addValueToList((ComplexType *)local_f0,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_f0);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_100);
    std::shared_ptr<NetworkAddress>::~shared_ptr((shared_ptr<NetworkAddress> *)(local_120 + 0x10));
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
    std::make_shared<IntegerType,short&>((short *)(local_150 + 0x10));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              (&local_130,(shared_ptr<IntegerType> *)(local_150 + 0x10));
    ComplexType::addValueToList((ComplexType *)local_120,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_120);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_130);
    std::shared_ptr<IntegerType>::~shared_ptr((shared_ptr<IntegerType> *)(local_150 + 0x10));
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
    std::make_shared<IntegerType,short&>((short *)(local_180 + 0x10));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              (&local_160,(shared_ptr<IntegerType> *)(local_180 + 0x10));
    ComplexType::addValueToList((ComplexType *)local_150,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_150);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_160);
    std::shared_ptr<IntegerType>::~shared_ptr((shared_ptr<IntegerType> *)(local_180 + 0x10));
    if (this->uptimeCallback == (TimestampCallback *)0x0) {
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = 0;
      std::make_shared<TimestampType,int>((int *)&local_1e0);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>(&local_1d0,&local_1e0);
      ComplexType::addValueToList((ComplexType *)local_1c0,(shared_ptr<BER_CONTAINER> *)peVar2);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_1c0);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_1d0);
      std::shared_ptr<TimestampType>::~shared_ptr(&local_1e0);
    }
    else {
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_1b0,&this->uptimeCallback->super_ValueCallback);
      std::static_pointer_cast<TimestampType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)(local_1b0 + 0x10));
      std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>
                (&local_190,(shared_ptr<TimestampType> *)(local_1b0 + 0x10));
      ComplexType::addValueToList((ComplexType *)local_180,(shared_ptr<BER_CONTAINER> *)peVar2);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_180);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_190);
      std::shared_ptr<TimestampType>::~shared_ptr((shared_ptr<TimestampType> *)(local_1b0 + 0x10));
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_1b0);
    }
    (*(this->super_SNMPPacket)._vptr_SNMPPacket[3])(local_1f8);
    this_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1f8);
    if ((bool)this_local._7_1_) {
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
                ((shared_ptr<BER_CONTAINER> *)(local_230 + 0x10),
                 (shared_ptr<ComplexType> *)local_1f8);
      ComplexType::addValueToList((ComplexType *)local_210,(shared_ptr<BER_CONTAINER> *)peVar2);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_210);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)(local_230 + 0x10));
      pCVar1 = (this->super_SNMPPacket).packet;
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
                (&local_240,(shared_ptr<ComplexType> *)local_a8);
      ComplexType::addValueToList((ComplexType *)local_230,(shared_ptr<BER_CONTAINER> *)pCVar1);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_230);
      std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_240);
    }
    local_210._20_4_ = 1;
    std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_1f8);
    std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_a8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SNMPTrap::build(){
    // Building V1 Traps
    delete packet;

    if(!this->trapOID) return false;

    packet = new ComplexType(STRUCTURE);

    packet->addValueToList(std::make_shared<IntegerType>((int)this->snmpVersion));
    packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));
    auto trapPDU = std::make_shared<ComplexType>(TrapPDU);
    
    trapPDU->addValueToList(trapOID->cloneOID());
    trapPDU->addValueToList(std::make_shared<NetworkAddress>(agentIP));
    trapPDU->addValueToList(std::make_shared<IntegerType>(genericTrap));
    trapPDU->addValueToList(std::make_shared<IntegerType>(specificTrap));
    
    if(uptimeCallback){
        trapPDU->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
    } else {
        trapPDU->addValueToList(std::make_shared<TimestampType>(0));
    }

    auto ourVBList = this->generateVarBindList();
    if(!ourVBList) return false;
    
    trapPDU->addValueToList(ourVBList);
    packet->addValueToList(trapPDU);
    return true;
}